

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,IfStmt *stmt)

{
  VarType VVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar4;
  VarException *pVVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<const_kratos::IRNode_*> __l_04;
  IRNode *local_d0;
  IfStmt *local_c8;
  Stmt *local_c0;
  undefined1 local_b8 [8];
  shared_ptr<kratos::Port> port_s;
  shared_ptr<kratos::Port> port_1;
  element_type *port;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  undefined1 local_50 [39];
  allocator_type local_29;
  
  peVar3 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  VVar1 = peVar3->type_;
  local_c8 = stmt;
  local_88._8_8_ = stmt;
  if (VVar1 == Expression) {
    Var::as<kratos::Expr>((Var *)local_b8);
    if (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_b8 + 0x270))->
                _vptr__Sp_counted_base & 0xfffffffffffffffb) == 0) {
      Var::as<kratos::Var>
                ((Var *)&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      if (port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          [0x16]._M_use_count == 4) {
        Var::as<kratos::Port>
                  ((Var *)&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        iVar2 = *(int *)((long)&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[0x27]._vptr__Sp_counted_base + 4);
        if (iVar2 == 3) {
          local_50._0_8_ =
               port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          iVar4 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->reset_map_)._M_h,(key_type *)local_50);
          if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur !=
              (__node_type *)0x0) {
            pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
            (*(port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base[0x1f])(local_70);
            local_88._0_8_ = local_70[0]._M_allocated_capacity;
            local_88._8_8_ = local_70[0]._8_8_;
            format_str_02.size_ = 0xd;
            format_str_02.data_ = (char *)0x30;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_88;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_50,
                       (detail *)"{0} is synchronous reset but used as async reset",format_str_02,
                       args_02);
            local_d0 = (IRNode *)
                       port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
            local_c0 = get_reset_stmt(this,(Port *)port_s.
                                                  super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
            __l_04._M_len = 3;
            __l_04._M_array = &local_d0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_88,__l_04,&local_29);
            VarException::VarException
                      (pVVar5,(string *)local_50,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_88);
            __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if (iVar2 == 2) {
          local_50._0_8_ =
               port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          iVar4 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->reset_map_)._M_h,(key_type *)local_50);
          if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
              (__node_type *)0x0) {
            pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
            (*(port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base[0x1f])(local_70);
            local_88._0_8_ = local_70[0]._M_allocated_capacity;
            local_88._8_8_ = local_70[0]._8_8_;
            format_str_01.size_ = 0xd;
            format_str_01.data_ = (char *)0x23;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_88;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_50,(detail *)"{0} is used has a synchronous reset",
                       format_str_01,args_01);
            local_d0 = (IRNode *)
                       port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
            __l_03._M_len = 2;
            __l_03._M_array = &local_d0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_88,__l_03,&local_29);
            VarException::VarException
                      (pVVar5,(string *)local_50,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_88);
            __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          local_50._0_8_ =
               port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          iVar4 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->reset_map_)._M_h,(key_type *)local_50);
          if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
              (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          if (*(char *)((long)iVar4.
                              super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>
                              ._M_cur + 0x10) == '\x01') {
            pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
            local_50._0_8_ = local_50 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"Active high signal used as active low","");
            local_88._0_8_ =
                 port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            __l_00._M_len = 2;
            __l_00._M_array = (iterator)local_88;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_70,__l_00,(allocator_type *)&local_d0);
            VarException::VarException
                      (pVVar5,(string *)local_50,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_70);
            __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        if (port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (port != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port);
      }
    }
  }
  else {
    if (VVar1 != PortIO) goto LAB_0022018f;
    Var::as<kratos::Port>((Var *)local_b8);
    port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8;
    iVar2 = *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)local_b8 + 0x270))->_vptr__Sp_counted_base + 4);
    if (iVar2 == 3) {
      iVar4 = std::
              _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->reset_map_)._M_h,
                     (key_type *)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur !=
          (__node_type *)0x0) {
        pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
        (*(port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x1f])(local_70);
        local_88._0_8_ = local_70[0]._M_allocated_capacity;
        local_88._8_8_ = local_70[0]._8_8_;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x30;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_50,(detail *)"{0} is synchronous reset but used as async reset",
                   format_str,args);
        local_d0 = (IRNode *)
                   port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        local_c0 = get_reset_stmt(this,(Port *)port_1.
                                               super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
        __l_01._M_len = 3;
        __l_01._M_array = &local_d0;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88,__l_01,
                   (allocator_type *)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        VarException::VarException
                  (pVVar5,(string *)local_50,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88);
        __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if (iVar2 == 2) {
      iVar4 = std::
              _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->reset_map_)._M_h,
                     (key_type *)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
          (__node_type *)0x0) {
        pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
        (*(port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x1f])(local_70);
        local_88._0_8_ = local_70[0]._M_allocated_capacity;
        local_88._8_8_ = local_70[0]._8_8_;
        format_str_00.size_ = 0xd;
        format_str_00.data_ = (char *)0x23;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_50,(detail *)"{0} is used has a synchronous reset",format_str_00,
                   args_00);
        local_d0 = (IRNode *)
                   port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        __l_02._M_len = 2;
        __l_02._M_array = &local_d0;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88,__l_02,
                   (allocator_type *)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        VarException::VarException
                  (pVVar5,(string *)local_50,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88);
        __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar4 = std::
              _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->reset_map_)._M_h,
                     (key_type *)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
          (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      if (*(char *)((long)iVar4.
                          super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>.
                          _M_cur + 0x10) == '\0') {
        pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Active low signal used as active high","");
        local_88._0_8_ =
             port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __l._M_len = 2;
        __l._M_array = (iterator)local_88;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_70,__l,(allocator_type *)&local_d0);
        VarException::VarException
                  (pVVar5,(string *)local_50,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_70);
        __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  if (port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_0022018f:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        auto predicate = stmt->predicate();
        // notice this just catch some simple mistakes
        // thus is designed to be zero false negative
        if (predicate->type() == VarType::PortIO) {
            auto port_s = predicate->as<Port>();
            auto* port = port_s.get();
            if (port->port_type() == PortType::AsyncReset) {
                if (reset_map_.find(port) == reset_map_.end()) {
                    // it's used as a sync reset
                    throw VarException(
                        ::format("{0} is used has a synchronous reset", port->to_string()),
                        {port, stmt});
                }
                bool reset_high = reset_map_.at(port);
                if (!reset_high)
                    throw VarException("Active low signal used as active high", {port, stmt});
            } else if (port->port_type() == PortType::Reset) {
                if (reset_map_.find(port) != reset_map_.end()) {
                    throw VarException(::format("{0} is synchronous reset but used as async reset",
                                                port->to_string()),
                                       {port, stmt, get_reset_stmt(port)});
                }
            }
        } else if (predicate->type() == VarType::Expression) {
            auto expr = predicate->as<Expr>();
            if (expr->op == ExprOp::UNot || expr->op == ExprOp::UInvert) {
                auto var = expr->left->as<Var>();
                if (var->type() == VarType::PortIO) {
                    auto port = var->as<Port>();
                    if (port->port_type() == PortType::AsyncReset) {
                        if (reset_map_.find(port.get()) == reset_map_.end()) {
                            // it's used as a sync reset
                            throw VarException(
                                ::format("{0} is used has a synchronous reset", port->to_string()),
                                {port.get(), stmt});
                        }
                        bool reset_high = reset_map_.at(port.get());
                        if (reset_high) {
                            throw VarException("Active high signal used as active low",
                                               {port.get(), stmt});
                        }
                    } else if (port->port_type() == PortType::Reset) {
                        if (reset_map_.find(port.get()) != reset_map_.end()) {
                            throw VarException(
                                ::format("{0} is synchronous reset but used as async reset",
                                         port->to_string()),
                                {port.get(), stmt, get_reset_stmt(port.get())});
                        }
                    }
                }
            }
        }
    }